

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaBuildCommand.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_988a7::BuildContext::processHadError
          (BuildContext *this,ProcessContext *param_1,ProcessHandle param_2,Twine *message)

{
  string local_30;
  
  llvm::Twine::str_abi_cxx11_(&local_30,message);
  emitError(this,&local_30);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void processHadError(ProcessContext*, ProcessHandle,
                       const Twine& message) override {
    emitError(message.str());
  }